

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,UintUintPair *key,ConcatMetrics *value)

{
  BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  code *pcVar5;
  long lVar6;
  bool bVar7;
  hash_t hVar8;
  int iVar9;
  undefined4 *puVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint key_00;
  undefined1 auVar15 [16];
  
  lVar14 = *(long *)this;
  if (lVar14 == 0) {
    BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar14 = *(long *)this;
  }
  key_00 = (key->first * 2 | key->second << 0x11) >> 1;
  hVar8 = PrimePolicy::ModPrime(key_00,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar11 = *(uint *)(lVar14 + (ulong)hVar8 * 4);
  if ((int)uVar11 < 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    do {
      uVar3 = *(undefined8 *)(*(long *)(this + 8) + 0x14 + (ulong)uVar11 * 0x1c);
      auVar15._0_4_ = -(uint)((uint)uVar3 == (*key).first);
      auVar15._4_4_ = -(uint)((uint)((ulong)uVar3 >> 0x20) == (*key).second);
      auVar15._8_4_ = 0xffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar15 = pmovsxdq(auVar15,auVar15);
      iVar12 = movmskpd(uVar11,auVar15);
      if (iVar12 == 3) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar13);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar7) {
          *puVar10 = 0;
          return -1;
        }
        goto LAB_00d39c77;
      }
      uVar13 = uVar13 + 1;
      uVar11 = *(uint *)((ulong)uVar11 * 0x1c + *(long *)(this + 8) + 0x10);
    } while (-1 < (int)uVar11);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar13);
  }
  if (*(int *)(this + 0x28) == 0) {
    iVar9 = *(int *)(this + 0x18);
    iVar12 = *(int *)(this + 0x20);
    if (iVar12 == iVar9) {
      BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      hVar8 = PrimePolicy::ModPrime(key_00,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
      iVar9 = *(int *)(this + 0x18);
      iVar12 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar12 + 1;
    if (iVar9 < iVar12 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar7) goto LAB_00d39c77;
      *puVar10 = 0;
      iVar9 = *(int *)(this + 0x18);
    }
    if (iVar9 <= iVar12) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar7) goto LAB_00d39c77;
      *puVar10 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar7) goto LAB_00d39c77;
      *puVar10 = 0;
    }
    iVar12 = *(int *)(this + 0x24);
    if (iVar12 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar7) goto LAB_00d39c77;
      *puVar10 = 0;
      iVar12 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar12) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar7) {
LAB_00d39c77:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar10 = 0;
      iVar12 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar9 = BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)iVar12 * 0x1c + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar9;
    }
  }
  lVar14 = *(long *)(this + 8);
  lVar6 = (long)iVar12 * 0x1c;
  uVar3 = *(undefined8 *)&value->bufferStringBuilderCount;
  puVar2 = (undefined8 *)(lVar14 + lVar6);
  *puVar2 = *(undefined8 *)value;
  puVar2[1] = uVar3;
  *(UintUintPair *)(lVar14 + 0x14 + lVar6) = *key;
  lVar14 = *(long *)this;
  lVar4 = *(long *)(this + 8);
  *(undefined4 *)(lVar4 + 0x10 + lVar6) = *(undefined4 *)(lVar14 + (ulong)hVar8 * 4);
  *(int *)(lVar14 + (ulong)hVar8 * 4) = iVar12;
  uVar13 = 0;
  iVar9 = iVar12;
  do {
    iVar9 = *(int *)(lVar4 + 0x10 + (long)iVar9 * 0x1c);
    uVar13 = uVar13 + 1;
  } while (iVar9 != -1);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar13);
  }
  return iVar12;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }